

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SourceCodeUtilities.cpp
# Opt level: O2

void soul::SourceCodeUtilities::iterateSyntaxTokens
               (CodeLocation *start,
               function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
               *handleToken)

{
  char *__s;
  char *pcVar1;
  bool bVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  char *pcVar7;
  char *pcVar8;
  char *pcVar9;
  basic_string_view<char,_std::char_traits<char>_> __args;
  basic_string_view<char,_std::char_traits<char>_> __args_00;
  basic_string_view<char,_std::char_traits<char>_> __y;
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __args_1;
  basic_string_view<char,_std::char_traits<char>_> __args_1_00;
  TokenType local_c0;
  char *local_b8;
  function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
  *local_b0;
  SimpleTokeniser tokeniser;
  
  local_b0 = handleToken;
  SimpleTokeniser::SimpleTokeniser(&tokeniser,start,false);
  local_b8 = (start->location).data;
  sVar4 = 0;
  pcVar7 = (char *)0x0;
  while (__s = local_b8,
        bVar2 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                ::matches(&tokeniser.super_SOULTokeniser,(TokenType)0x29b6f4), !bVar2) {
    local_b8 = tokeniser.super_SOULTokeniser.location.location.data;
    local_c0.text = tokeniser.super_SOULTokeniser.currentType.text;
    bVar2 = TokenType::operator==(&local_c0,(TokenType *)&Keyword::if_);
    pcVar8 = "hljs-keyword";
    sVar5 = 0xc;
    if (!bVar2) {
      bVar2 = TokenType::operator==(&local_c0,(TokenType *)&Keyword::do_);
      pcVar8 = "hljs-keyword";
      if (!bVar2) {
        bVar2 = TokenType::operator==(&local_c0,(TokenType *)&Keyword::for_);
        pcVar8 = "hljs-keyword";
        if (!bVar2) {
          bVar2 = TokenType::operator==(&local_c0,(TokenType *)&Keyword::let);
          pcVar8 = "hljs-keyword";
          if (!bVar2) {
            bVar2 = TokenType::operator==(&local_c0,(TokenType *)&Keyword::var);
            pcVar8 = "hljs-keyword";
            if (!bVar2) {
              bVar2 = TokenType::operator==(&local_c0,(TokenType *)&Keyword::int_);
              pcVar8 = "hljs-keyword";
              if (!bVar2) {
                bVar2 = TokenType::operator==(&local_c0,(TokenType *)&Keyword::try_);
                pcVar8 = "hljs-keyword";
                if (!bVar2) {
                  bVar2 = TokenType::operator==(&local_c0,(TokenType *)&Keyword::else_);
                  pcVar8 = "hljs-keyword";
                  if (!bVar2) {
                    bVar2 = TokenType::operator==(&local_c0,(TokenType *)&Keyword::bool_);
                    pcVar8 = "hljs-keyword";
                    if (!bVar2) {
                      bVar2 = TokenType::operator==(&local_c0,(TokenType *)&Keyword::true_);
                      pcVar8 = "hljs-keyword";
                      if (!bVar2) {
                        bVar2 = TokenType::operator==(&local_c0,(TokenType *)&Keyword::case_);
                        pcVar8 = "hljs-keyword";
                        if (!bVar2) {
                          bVar2 = TokenType::operator==(&local_c0,(TokenType *)&Keyword::enum_);
                          pcVar8 = "hljs-keyword";
                          if (!bVar2) {
                            bVar2 = TokenType::operator==(&local_c0,(TokenType *)&Keyword::loop);
                            pcVar8 = "hljs-keyword";
                            if (!bVar2) {
                              bVar2 = TokenType::operator==(&local_c0,(TokenType *)&Keyword::void_);
                              pcVar8 = "hljs-keyword";
                              if (!bVar2) {
                                bVar2 = TokenType::operator==
                                                  (&local_c0,(TokenType *)&Keyword::while_);
                                pcVar8 = "hljs-keyword";
                                if (!bVar2) {
                                  bVar2 = TokenType::operator==
                                                    (&local_c0,(TokenType *)&Keyword::break_);
                                  pcVar8 = "hljs-keyword";
                                  if (!bVar2) {
                                    bVar2 = TokenType::operator==
                                                      (&local_c0,(TokenType *)&Keyword::const_);
                                    pcVar8 = "hljs-keyword";
                                    if (!bVar2) {
                                      bVar2 = TokenType::operator==
                                                        (&local_c0,(TokenType *)&Keyword::int32);
                                      pcVar8 = "hljs-keyword";
                                      if (!bVar2) {
                                        bVar2 = TokenType::operator==
                                                          (&local_c0,(TokenType *)&Keyword::int64);
                                        pcVar8 = "hljs-keyword";
                                        if (!bVar2) {
                                          bVar2 = TokenType::operator==
                                                            (&local_c0,(TokenType *)&Keyword::float_
                                                            );
                                          pcVar8 = "hljs-keyword";
                                          if (!bVar2) {
                                            bVar2 = TokenType::operator==
                                                              (&local_c0,
                                                               (TokenType *)&Keyword::false_);
                                            pcVar8 = "hljs-keyword";
                                            if (!bVar2) {
                                              bVar2 = TokenType::operator==
                                                                (&local_c0,
                                                                 (TokenType *)&Keyword::using_);
                                              pcVar8 = "hljs-keyword";
                                              if (!bVar2) {
                                                bVar2 = TokenType::operator==
                                                                  (&local_c0,
                                                                   (TokenType *)&Keyword::fixed);
                                                pcVar8 = "hljs-keyword";
                                                if (!bVar2) {
                                                  bVar2 = TokenType::operator==
                                                                    (&local_c0,
                                                                     (TokenType *)&Keyword::graph);
                                                  pcVar8 = "hljs-keyword";
                                                  if (!bVar2) {
                                                    bVar2 = TokenType::operator==
                                                                      (&local_c0,
                                                                       (TokenType *)&Keyword::input)
                                                    ;
                                                    pcVar8 = "hljs-keyword";
                                                    if (!bVar2) {
                                                      bVar2 = TokenType::operator==
                                                                        (&local_c0,
                                                                         (TokenType *)
                                                                         &Keyword::event);
                                                      pcVar8 = "hljs-keyword";
                                                      if (!bVar2) {
                                                        bVar2 = TokenType::operator==
                                                                          (&local_c0,
                                                                           (TokenType *)
                                                                           &Keyword::class_);
                                                        pcVar8 = "hljs-keyword";
                                                        if (!bVar2) {
                                                          bVar2 = TokenType::operator==
                                                                            (&local_c0,
                                                                             (TokenType *)
                                                                             &Keyword::catch_);
                                                          pcVar8 = "hljs-keyword";
                                                          if (!bVar2) {
                                                            bVar2 = TokenType::operator==
                                                                              (&local_c0,
                                                                               (TokenType *)
                                                                               &Keyword::throw_);
                                                            pcVar8 = "hljs-keyword";
                                                            if (!bVar2) {
                                                              bVar2 = TokenType::operator==
                                                                                (&local_c0,
                                                                                 (TokenType *)
                                                                                 &Keyword::output);
                                                              pcVar8 = "hljs-keyword";
                                                              if (!bVar2) {
                                                                bVar2 = TokenType::operator==
                                                                                  (&local_c0,
                                                                                   (TokenType *)
                                                                                   &Keyword::return_
                                                                                  );
                                                                pcVar8 = "hljs-keyword";
                                                                if (!bVar2) {
                                                                  bVar2 = TokenType::operator==
                                                                                    (&local_c0,
                                                                                     (TokenType *)
                                                                                     &Keyword::
                                                  string);
                                                  pcVar8 = "hljs-keyword";
                                                  if (!bVar2) {
                                                    bVar2 = TokenType::operator==
                                                                      (&local_c0,
                                                                       (TokenType *)
                                                                       &Keyword::struct_);
                                                    pcVar8 = "hljs-keyword";
                                                    if (!bVar2) {
                                                      bVar2 = TokenType::operator==
                                                                        (&local_c0,
                                                                         (TokenType *)
                                                                         &Keyword::import);
                                                      pcVar8 = "hljs-keyword";
                                                      if (!bVar2) {
                                                        bVar2 = TokenType::operator==
                                                                          (&local_c0,
                                                                           (TokenType *)
                                                                           &Keyword::switch_);
                                                        pcVar8 = "hljs-keyword";
                                                        if (!bVar2) {
                                                          bVar2 = TokenType::operator==
                                                                            (&local_c0,
                                                                             (TokenType *)
                                                                             &Keyword::public_);
                                                          pcVar8 = "hljs-keyword";
                                                          if (!bVar2) {
                                                            bVar2 = TokenType::operator==
                                                                              (&local_c0,
                                                                               (TokenType *)
                                                                               &Keyword::double_);
                                                            pcVar8 = "hljs-keyword";
                                                            if (!bVar2) {
                                                              bVar2 = TokenType::operator==
                                                                                (&local_c0,
                                                                                 (TokenType *)
                                                                                 &Keyword::private_)
                                                              ;
                                                              pcVar8 = "hljs-keyword";
                                                              if (!bVar2) {
                                                                bVar2 = TokenType::operator==
                                                                                  (&local_c0,
                                                                                   (TokenType *)
                                                                                   &Keyword::float32
                                                                                  );
                                                                pcVar8 = "hljs-keyword";
                                                                if (!bVar2) {
                                                                  bVar2 = TokenType::operator==
                                                                                    (&local_c0,
                                                                                     (TokenType *)
                                                                                     &Keyword::
                                                  float64);
                                                  pcVar8 = "hljs-keyword";
                                                  if (!bVar2) {
                                                    bVar2 = TokenType::operator==
                                                                      (&local_c0,
                                                                       (TokenType *)
                                                                       &Keyword::default_);
                                                    pcVar8 = "hljs-keyword";
                                                    if (!bVar2) {
                                                      bVar2 = TokenType::operator==
                                                                        (&local_c0,
                                                                         (TokenType *)
                                                                         &Keyword::complex);
                                                      pcVar8 = "hljs-keyword";
                                                      if (!bVar2) {
                                                        bVar2 = TokenType::operator==
                                                                          (&local_c0,
                                                                           (TokenType *)
                                                                           &Keyword::continue_);
                                                        pcVar8 = "hljs-keyword";
                                                        if (!bVar2) {
                                                          bVar2 = TokenType::operator==
                                                                            (&local_c0,
                                                                             (TokenType *)
                                                                             &Keyword::external);
                                                          pcVar8 = "hljs-keyword";
                                                          if (!bVar2) {
                                                            bVar2 = TokenType::operator==
                                                                              (&local_c0,
                                                                               (TokenType *)
                                                                               &Keyword::operator_);
                                                            pcVar8 = "hljs-keyword";
                                                            if (!bVar2) {
                                                              bVar2 = TokenType::operator==
                                                                                (&local_c0,
                                                                                 (TokenType *)
                                                                                 &Keyword::processor
                                                                                );
                                                              pcVar8 = "hljs-keyword";
                                                              if (!bVar2) {
                                                                bVar2 = TokenType::operator==
                                                                                  (&local_c0,
                                                                                   (TokenType *)
                                                                                   &Keyword::
                                                  namespace_);
                                                  pcVar8 = "hljs-keyword";
                                                  if (!bVar2) {
                                                    bVar2 = TokenType::operator==
                                                                      (&local_c0,
                                                                       (TokenType *)
                                                                       &Keyword::complex32);
                                                    pcVar8 = "hljs-keyword";
                                                    if (!bVar2) {
                                                      bVar2 = TokenType::operator==
                                                                        (&local_c0,
                                                                         (TokenType *)
                                                                         &Keyword::complex64);
                                                      pcVar8 = "hljs-keyword";
                                                      if (!bVar2) {
                                                        pcVar8 = "hljs-keyword";
                                                        bVar2 = TokenType::operator==
                                                                          (&local_c0,
                                                                           (TokenType *)
                                                                           &Keyword::connection);
                                                        if (!bVar2) {
                                                          bVar2 = TokenType::operator==
                                                                            (&local_c0,
                                                                             (TokenType *)
                                                                             &Operator::semicolon);
                                                          pcVar8 = "hljs-operator";
                                                          sVar5 = 0xd;
                                                          if (!bVar2) {
                                                            bVar2 = TokenType::operator==
                                                                              (&local_c0,
                                                                               (TokenType *)
                                                                               &Operator::dot);
                                                            pcVar8 = "hljs-operator";
                                                            sVar5 = 0xd;
                                                            if (!bVar2) {
                                                              bVar2 = TokenType::operator==
                                                                                (&local_c0,
                                                                                 (TokenType *)
                                                                                 &Operator::comma);
                                                              pcVar8 = "hljs-operator";
                                                              sVar5 = 0xd;
                                                              if (!bVar2) {
                                                                bVar2 = TokenType::operator==
                                                                                  (&local_c0,
                                                                                   (TokenType *)
                                                                                   &Operator::
                                                                                    openParen);
                                                                pcVar8 = "hljs-operator";
                                                                sVar5 = 0xd;
                                                                if (!bVar2) {
                                                                  bVar2 = TokenType::operator==
                                                                                    (&local_c0,
                                                                                     (TokenType *)
                                                                                     &Operator::
                                                                                      closeParen);
                                                                  pcVar8 = "hljs-operator";
                                                                  sVar5 = 0xd;
                                                                  if (!bVar2) {
                                                                    bVar2 = TokenType::operator==
                                                                                      (&local_c0,
                                                                                       (TokenType *)
                                                                                       &Operator::
                                                                                        openBrace);
                                                                    pcVar8 = "hljs-operator";
                                                                    sVar5 = 0xd;
                                                                    if (!bVar2) {
                                                                      bVar2 = TokenType::operator==
                                                                                        (&local_c0,
                                                                                         (TokenType 
                                                  *)&Operator::closeBrace);
                                                  pcVar8 = "hljs-operator";
                                                  sVar5 = 0xd;
                                                  if (!bVar2) {
                                                    bVar2 = TokenType::operator==
                                                                      (&local_c0,
                                                                       (TokenType *)
                                                                       &Operator::openDoubleBracket)
                                                    ;
                                                    pcVar8 = "hljs-operator";
                                                    sVar5 = 0xd;
                                                    if (!bVar2) {
                                                      bVar2 = TokenType::operator==
                                                                        (&local_c0,
                                                                         (TokenType *)
                                                                         &Operator::
                                                                          closeDoubleBracket);
                                                      pcVar8 = "hljs-operator";
                                                      sVar5 = 0xd;
                                                      if (!bVar2) {
                                                        bVar2 = TokenType::operator==
                                                                          (&local_c0,
                                                                           (TokenType *)
                                                                           &Operator::openBracket);
                                                        pcVar8 = "hljs-operator";
                                                        sVar5 = 0xd;
                                                        if (!bVar2) {
                                                          bVar2 = TokenType::operator==
                                                                            (&local_c0,
                                                                             (TokenType *)
                                                                             &Operator::closeBracket
                                                                            );
                                                          pcVar8 = "hljs-operator";
                                                          sVar5 = 0xd;
                                                          if (!bVar2) {
                                                            bVar2 = TokenType::operator==
                                                                              (&local_c0,
                                                                               (TokenType *)
                                                                               &Operator::
                                                                                doubleColon);
                                                            pcVar8 = "hljs-operator";
                                                            sVar5 = 0xd;
                                                            if (!bVar2) {
                                                              bVar2 = TokenType::operator==
                                                                                (&local_c0,
                                                                                 (TokenType *)
                                                                                 &Operator::colon);
                                                              pcVar8 = "hljs-operator";
                                                              sVar5 = 0xd;
                                                              if (!bVar2) {
                                                                bVar2 = TokenType::operator==
                                                                                  (&local_c0,
                                                                                   (TokenType *)
                                                                                   &Operator::
                                                                                    question);
                                                                pcVar8 = "hljs-operator";
                                                                sVar5 = 0xd;
                                                                if (!bVar2) {
                                                                  bVar2 = TokenType::operator==
                                                                                    (&local_c0,
                                                                                     (TokenType *)
                                                                                     &Operator::
                                                                                      equals);
                                                                  pcVar8 = "hljs-operator";
                                                                  sVar5 = 0xd;
                                                                  if (!bVar2) {
                                                                    bVar2 = TokenType::operator==
                                                                                      (&local_c0,
                                                                                       (TokenType *)
                                                                                       &Operator::
                                                                                        assign);
                                                                    pcVar8 = "hljs-operator";
                                                                    sVar5 = 0xd;
                                                                    if (!bVar2) {
                                                                      bVar2 = TokenType::operator==
                                                                                        (&local_c0,
                                                                                         (TokenType 
                                                  *)&Operator::notEquals);
                                                  pcVar8 = "hljs-operator";
                                                  sVar5 = 0xd;
                                                  if (!bVar2) {
                                                    bVar2 = TokenType::operator==
                                                                      (&local_c0,
                                                                       (TokenType *)
                                                                       &Operator::logicalNot);
                                                    pcVar8 = "hljs-operator";
                                                    sVar5 = 0xd;
                                                    if (!bVar2) {
                                                      bVar2 = TokenType::operator==
                                                                        (&local_c0,
                                                                         (TokenType *)
                                                                         &Operator::plusEquals);
                                                      pcVar8 = "hljs-operator";
                                                      sVar5 = 0xd;
                                                      if (!bVar2) {
                                                        bVar2 = TokenType::operator==
                                                                          (&local_c0,
                                                                           (TokenType *)
                                                                           &Operator::plusplus);
                                                        pcVar8 = "hljs-operator";
                                                        sVar5 = 0xd;
                                                        if (!bVar2) {
                                                          bVar2 = TokenType::operator==
                                                                            (&local_c0,
                                                                             (TokenType *)
                                                                             &Operator::plus);
                                                          pcVar8 = "hljs-operator";
                                                          sVar5 = 0xd;
                                                          if (!bVar2) {
                                                            bVar2 = TokenType::operator==
                                                                              (&local_c0,
                                                                               (TokenType *)
                                                                               &Operator::
                                                                                minusEquals);
                                                            pcVar8 = "hljs-operator";
                                                            sVar5 = 0xd;
                                                            if (!bVar2) {
                                                              bVar2 = TokenType::operator==
                                                                                (&local_c0,
                                                                                 (TokenType *)
                                                                                 &Operator::
                                                                                  minusminus);
                                                              pcVar8 = "hljs-operator";
                                                              sVar5 = 0xd;
                                                              if (!bVar2) {
                                                                bVar2 = TokenType::operator==
                                                                                  (&local_c0,
                                                                                   (TokenType *)
                                                                                   &Operator::
                                                                                    rightArrow);
                                                                pcVar8 = "hljs-operator";
                                                                sVar5 = 0xd;
                                                                if (!bVar2) {
                                                                  bVar2 = TokenType::operator==
                                                                                    (&local_c0,
                                                                                     (TokenType *)
                                                                                     &Operator::
                                                                                      minus);
                                                                  pcVar8 = "hljs-operator";
                                                                  sVar5 = 0xd;
                                                                  if (!bVar2) {
                                                                    bVar2 = TokenType::operator==
                                                                                      (&local_c0,
                                                                                       (TokenType *)
                                                                                       &Operator::
                                                                                        timesEquals)
                                                                    ;
                                                                    pcVar8 = "hljs-operator";
                                                                    sVar5 = 0xd;
                                                                    if (!bVar2) {
                                                                      bVar2 = TokenType::operator==
                                                                                        (&local_c0,
                                                                                         (TokenType 
                                                  *)&Operator::times);
                                                  pcVar8 = "hljs-operator";
                                                  sVar5 = 0xd;
                                                  if (!bVar2) {
                                                    bVar2 = TokenType::operator==
                                                                      (&local_c0,
                                                                       (TokenType *)
                                                                       &Operator::divideEquals);
                                                    pcVar8 = "hljs-operator";
                                                    sVar5 = 0xd;
                                                    if (!bVar2) {
                                                      bVar2 = TokenType::operator==
                                                                        (&local_c0,
                                                                         (TokenType *)
                                                                         &Operator::divide);
                                                      pcVar8 = "hljs-operator";
                                                      sVar5 = 0xd;
                                                      if (!bVar2) {
                                                        bVar2 = TokenType::operator==
                                                                          (&local_c0,
                                                                           (TokenType *)
                                                                           &Operator::moduloEquals);
                                                        pcVar8 = "hljs-operator";
                                                        sVar5 = 0xd;
                                                        if (!bVar2) {
                                                          bVar2 = TokenType::operator==
                                                                            (&local_c0,
                                                                             (TokenType *)
                                                                             &Operator::modulo);
                                                          pcVar8 = "hljs-operator";
                                                          sVar5 = 0xd;
                                                          if (!bVar2) {
                                                            bVar2 = TokenType::operator==
                                                                              (&local_c0,
                                                                               (TokenType *)
                                                                               &Operator::xorEquals)
                                                            ;
                                                            pcVar8 = "hljs-operator";
                                                            sVar5 = 0xd;
                                                            if (!bVar2) {
                                                              bVar2 = TokenType::operator==
                                                                                (&local_c0,
                                                                                 (TokenType *)
                                                                                 &Operator::
                                                                                  bitwiseXor);
                                                              pcVar8 = "hljs-operator";
                                                              sVar5 = 0xd;
                                                              if (!bVar2) {
                                                                bVar2 = TokenType::operator==
                                                                                  (&local_c0,
                                                                                   (TokenType *)
                                                                                   &Operator::
                                                                                    bitwiseAndEquals
                                                                                  );
                                                                pcVar8 = "hljs-operator";
                                                                sVar5 = 0xd;
                                                                if (!bVar2) {
                                                                  bVar2 = TokenType::operator==
                                                                                    (&local_c0,
                                                                                     (TokenType *)
                                                                                     &Operator::
                                                                                                                                                                            
                                                  logicalAndEquals);
                                                  pcVar8 = "hljs-operator";
                                                  sVar5 = 0xd;
                                                  if (!bVar2) {
                                                    bVar2 = TokenType::operator==
                                                                      (&local_c0,
                                                                       (TokenType *)
                                                                       &Operator::logicalAnd);
                                                    pcVar8 = "hljs-operator";
                                                    sVar5 = 0xd;
                                                    if (!bVar2) {
                                                      bVar2 = TokenType::operator==
                                                                        (&local_c0,
                                                                         (TokenType *)
                                                                         &Operator::bitwiseAnd);
                                                      pcVar8 = "hljs-operator";
                                                      sVar5 = 0xd;
                                                      if (!bVar2) {
                                                        bVar2 = TokenType::operator==
                                                                          (&local_c0,
                                                                           (TokenType *)
                                                                           &Operator::
                                                                            bitwiseOrEquals);
                                                        pcVar8 = "hljs-operator";
                                                        sVar5 = 0xd;
                                                        if (!bVar2) {
                                                          bVar2 = TokenType::operator==
                                                                            (&local_c0,
                                                                             (TokenType *)
                                                                             &Operator::
                                                                              logicalOrEquals);
                                                          pcVar8 = "hljs-operator";
                                                          sVar5 = 0xd;
                                                          if (!bVar2) {
                                                            bVar2 = TokenType::operator==
                                                                              (&local_c0,
                                                                               (TokenType *)
                                                                               &Operator::logicalOr)
                                                            ;
                                                            pcVar8 = "hljs-operator";
                                                            sVar5 = 0xd;
                                                            if (!bVar2) {
                                                              bVar2 = TokenType::operator==
                                                                                (&local_c0,
                                                                                 (TokenType *)
                                                                                 &Operator::
                                                                                  bitwiseOr);
                                                              pcVar8 = "hljs-operator";
                                                              sVar5 = 0xd;
                                                              if (!bVar2) {
                                                                bVar2 = TokenType::operator==
                                                                                  (&local_c0,
                                                                                   (TokenType *)
                                                                                   &Operator::
                                                                                    bitwiseNot);
                                                                pcVar8 = "hljs-operator";
                                                                sVar5 = 0xd;
                                                                if (!bVar2) {
                                                                  bVar2 = TokenType::operator==
                                                                                    (&local_c0,
                                                                                     (TokenType *)
                                                                                     &Operator::
                                                                                                                                                                            
                                                  leftShiftEquals);
                                                  pcVar8 = "hljs-operator";
                                                  sVar5 = 0xd;
                                                  if (!bVar2) {
                                                    bVar2 = TokenType::operator==
                                                                      (&local_c0,
                                                                       (TokenType *)
                                                                       &Operator::leftShift);
                                                    pcVar8 = "hljs-operator";
                                                    sVar5 = 0xd;
                                                    if (!bVar2) {
                                                      bVar2 = TokenType::operator==
                                                                        (&local_c0,
                                                                         (TokenType *)
                                                                         &Operator::lessThanOrEqual)
                                                      ;
                                                      pcVar8 = "hljs-operator";
                                                      sVar5 = 0xd;
                                                      if (!bVar2) {
                                                        bVar2 = TokenType::operator==
                                                                          (&local_c0,
                                                                           (TokenType *)
                                                                           &Operator::lessThan);
                                                        pcVar8 = "hljs-operator";
                                                        sVar5 = 0xd;
                                                        if (!bVar2) {
                                                          bVar2 = TokenType::operator==
                                                                            (&local_c0,
                                                                             (TokenType *)
                                                                             &Operator::
                                                                                                                                                            
                                                  rightShiftUnsignedEquals);
                                                  pcVar8 = "hljs-operator";
                                                  sVar5 = 0xd;
                                                  if (!bVar2) {
                                                    bVar2 = TokenType::operator==
                                                                      (&local_c0,
                                                                       (TokenType *)
                                                                       &Operator::rightShiftEquals);
                                                    pcVar8 = "hljs-operator";
                                                    sVar5 = 0xd;
                                                    if (!bVar2) {
                                                      bVar2 = TokenType::operator==
                                                                        (&local_c0,
                                                                         (TokenType *)
                                                                         &Operator::
                                                                          rightShiftUnsigned);
                                                      pcVar8 = "hljs-operator";
                                                      sVar5 = 0xd;
                                                      if (!bVar2) {
                                                        bVar2 = TokenType::operator==
                                                                          (&local_c0,
                                                                           (TokenType *)
                                                                           &Operator::rightShift);
                                                        pcVar8 = "hljs-operator";
                                                        sVar5 = 0xd;
                                                        if (!bVar2) {
                                                          bVar2 = TokenType::operator==
                                                                            (&local_c0,
                                                                             (TokenType *)
                                                                             &Operator::
                                                                              greaterThanOrEqual);
                                                          pcVar8 = "hljs-operator";
                                                          sVar5 = 0xd;
                                                          if (!bVar2) {
                                                            bVar2 = TokenType::operator==
                                                                              (&local_c0,
                                                                               (TokenType *)
                                                                               &Operator::
                                                                                greaterThan);
                                                            pcVar8 = "hljs-operator";
                                                            sVar5 = 0xd;
                                                            if (!bVar2) {
                                                              bVar2 = TokenType::operator==
                                                                                (&local_c0,
                                                                                 (TokenType *)
                                                                                 &Token::identifier)
                                                              ;
                                                              pcVar8 = "hljs-name";
                                                              sVar5 = 9;
                                                              if (!bVar2) {
                                                                bVar2 = TokenType::operator==
                                                                                  (&local_c0,
                                                                                   (TokenType *)
                                                                                   &Token::
                                                  literalInt32);
                                                  pcVar8 = "hljs-number";
                                                  sVar5 = 0xb;
                                                  if (!bVar2) {
                                                    bVar2 = TokenType::operator==
                                                                      (&local_c0,
                                                                       (TokenType *)
                                                                       &Token::literalInt64);
                                                    pcVar8 = "hljs-number";
                                                    sVar5 = 0xb;
                                                    if (!bVar2) {
                                                      bVar2 = TokenType::operator==
                                                                        (&local_c0,
                                                                         (TokenType *)
                                                                         &Token::literalFloat32);
                                                      pcVar8 = "hljs-number";
                                                      sVar5 = 0xb;
                                                      if (!bVar2) {
                                                        bVar2 = TokenType::operator==
                                                                          (&local_c0,
                                                                           (TokenType *)
                                                                           &Token::literalFloat64);
                                                        pcVar8 = "hljs-number";
                                                        sVar5 = 0xb;
                                                        if (!bVar2) {
                                                          bVar2 = TokenType::operator==
                                                                            (&local_c0,
                                                                             (TokenType *)
                                                                             &Token::literalImag32);
                                                          pcVar8 = "hljs-number";
                                                          sVar5 = 0xb;
                                                          if (!bVar2) {
                                                            bVar2 = TokenType::operator==
                                                                              (&local_c0,
                                                                               (TokenType *)
                                                                               &Token::literalImag64
                                                                              );
                                                            pcVar8 = "hljs-number";
                                                            sVar5 = 0xb;
                                                            if (!bVar2) {
                                                              bVar2 = TokenType::operator==
                                                                                (&local_c0,
                                                                                 (TokenType *)
                                                                                 &Token::
                                                  literalString);
                                                  pcVar8 = "hljs-string";
                                                  sVar5 = 0xb;
                                                  if (!bVar2) {
                                                    bVar2 = TokenType::operator==
                                                                      (&local_c0,
                                                                       (TokenType *)&Token::comment)
                                                    ;
                                                    pcVar8 = "hljs";
                                                    if (bVar2) {
                                                      pcVar8 = "hljs-comment";
                                                    }
                                                    sVar5 = (ulong)bVar2 * 8 + 4;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    __y._M_str = pcVar7;
    __y._M_len = sVar4;
    __x._M_str = pcVar8;
    __x._M_len = sVar5;
    bVar2 = std::operator!=(__x,__y);
    sVar6 = sVar4;
    pcVar9 = pcVar7;
    pcVar1 = __s;
    if (((bVar2) &&
        (__args._M_len = (long)local_b8 - (long)__s, sVar6 = sVar5, pcVar9 = pcVar8,
        pcVar1 = local_b8, __args._M_len != 0)) &&
       (__args._M_str = __s, __args_1._M_str = pcVar7, __args_1._M_len = sVar4,
       bVar2 = std::
               function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
               ::operator()(local_b0,__args,__args_1), pcVar1 = local_b8, !bVar2)) break;
    local_b8 = pcVar1;
    Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
    ::skip(&tokeniser.super_SOULTokeniser);
    sVar4 = sVar6;
    pcVar7 = pcVar9;
  }
  if (*__s != '\0') {
    sVar3 = strlen(__s);
    __args_00._M_str = __s;
    __args_00._M_len = sVar3;
    __args_1_00._M_str = pcVar7;
    __args_1_00._M_len = sVar4;
    std::
    function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
    ::operator()(local_b0,__args_00,__args_1_00);
  }
  Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
  ::~Tokeniser(&tokeniser.super_SOULTokeniser);
  return;
}

Assistant:

void SourceCodeUtilities::iterateSyntaxTokens (CodeLocation start,
                                               const std::function<bool(std::string_view, std::string_view)>& handleToken)
{
    auto getTokenType = [] (TokenType t) -> std::string_view
    {
       #define SOUL_COMPARE_KEYWORD(name, str) if (t == Keyword::name) return "hljs-keyword";
        SOUL_KEYWORDS (SOUL_COMPARE_KEYWORD)
       #undef SOUL_COMPARE_KEYWORD

       #define SOUL_COMPARE_OPERATOR(name, str) if (t == Operator::name) return "hljs-operator";
        SOUL_OPERATORS (SOUL_COMPARE_OPERATOR)
       #undef SOUL_COMPARE_OPERATOR

        if (t == Token::identifier)      return "hljs-name";
        if (t == Token::literalInt32)    return "hljs-number";
        if (t == Token::literalInt64)    return "hljs-number";
        if (t == Token::literalFloat32)  return "hljs-number";
        if (t == Token::literalFloat64)  return "hljs-number";
        if (t == Token::literalImag32)   return "hljs-number";
        if (t == Token::literalImag64)   return "hljs-number";
        if (t == Token::literalString)   return "hljs-string";
        if (t == Token::comment)         return "hljs-comment";

        return "hljs";
    };

    SimpleTokeniser tokeniser (start, false);
    auto currentSectionStart = start.location;
    std::string_view currentTokenType;

    try
    {
        while (! tokeniser.matches (Token::eof))
        {
            auto newPos = tokeniser.location.location;
            auto newType = getTokenType (tokeniser.currentType);

            if (newType != currentTokenType)
            {
                std::string_view tokenText (currentSectionStart.getAddress(),
                                            static_cast<size_t> (newPos.getAddress() - currentSectionStart.getAddress()));

                if (! tokenText.empty())
                    if (! handleToken (tokenText, currentTokenType))
                        break;

                currentSectionStart = newPos;
                currentTokenType = newType;
            }

            tokeniser.skip();
        }
    }
    catch (const AbortCompilationException&) {}

    if (currentSectionStart.isNotEmpty())
        handleToken (currentSectionStart.getAddress(), currentTokenType);
}